

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
* __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
::insert_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,false,false>>>
          *this,ID_index cellID,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary,
          Dimension dim)

{
  Dimension dim_local;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> *boundary_local;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_false,_false>_>_>
  *this_local;
  
  _reduce_boundary<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
            (__return_storage_ptr__,this,cellID,boundary,dim);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::insert_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  if constexpr (!Master_matrix::Option_list::has_map_column_container) {
    if (pivotToColumnIndex_.size() <= cellID) {
      pivotToColumnIndex_.resize(cellID * 2 + 1, Master_matrix::template get_null_value<Index>());
    }
  }

  if constexpr (Master_matrix::Option_list::has_vine_update && Master_matrix::Option_list::has_column_pairings) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      Swap_opt::CP::pivotToPosition_.try_emplace(cellID, _nextPosition());
    } else {
      if (Swap_opt::CP::pivotToPosition_.size() <= cellID)
        Swap_opt::CP::pivotToPosition_.resize(pivotToColumnIndex_.size(),
                                              Master_matrix::template get_null_value<Pos_index>());
      Swap_opt::CP::pivotToPosition_[cellID] = _nextPosition();
    }
  }

  if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
    Dim_opt::update_up(dim == Master_matrix::template get_null_value<Dimension>()
                           ? (boundary.size() == 0 ? 0 : boundary.size() - 1)
                           : dim);
  }

  return _reduce_boundary(cellID, boundary, dim);
}